

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<4,_0,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 *puVar3;
  float *b;
  int row;
  long lVar4;
  long lVar5;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vec4 *local_140;
  ulong local_138;
  float local_130 [6];
  float local_118 [4];
  float local_108 [6];
  float local_f0 [3];
  float local_e4 [3];
  Matrix<float,_4,_4> local_d8;
  Matrix<float,_4,_4> local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar1 = &local_58;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  puVar3 = &s_constInMat4;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar5) = *(undefined4 *)((long)puVar3 + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar3 = puVar3 + 1;
  } while (lVar4 != 4);
  pfVar2 = (float *)&local_98;
  local_98.m_data.m_data[3].m_data[0] = 0.0;
  local_98.m_data.m_data[3].m_data[1] = 0.0;
  local_98.m_data.m_data[3].m_data[2] = 0.0;
  local_98.m_data.m_data[3].m_data[3] = 0.0;
  local_98.m_data.m_data[2].m_data[0] = 0.0;
  local_98.m_data.m_data[2].m_data[1] = 0.0;
  local_98.m_data.m_data[2].m_data[2] = 0.0;
  local_98.m_data.m_data[2].m_data[3] = 0.0;
  local_98.m_data.m_data[1].m_data[0] = 0.0;
  local_98.m_data.m_data[1].m_data[1] = 0.0;
  local_98.m_data.m_data[1].m_data[2] = 0.0;
  local_98.m_data.m_data[1].m_data[3] = 0.0;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  local_98.m_data.m_data[0].m_data[2] = 0.0;
  local_98.m_data.m_data[0].m_data[3] = 0.0;
  b = (float *)&DAT_02292ac0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pfVar2 + lVar5) =
           *(undefined4 *)((long)(((Matrix<float,_4,_4> *)b)->m_data).m_data[0].m_data + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    b = (((Matrix<float,_4,_4> *)b)->m_data).m_data[0].m_data + 1;
  } while (lVar4 != 4);
  matrixCompMult<float,4,4>
            (&local_d8,(MatrixCaseUtils *)&local_58,&local_98,(Matrix<float,_4,_4> *)b);
  local_e4[0] = local_d8.m_data.m_data[0].m_data[0];
  local_e4[1] = local_d8.m_data.m_data[0].m_data[1];
  local_e4[2] = local_d8.m_data.m_data[0].m_data[2];
  local_f0[0] = local_d8.m_data.m_data[1].m_data[1];
  local_f0[1] = local_d8.m_data.m_data[1].m_data[2];
  local_f0[2] = local_d8.m_data.m_data[1].m_data[3];
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar4 = 0;
  do {
    local_118[lVar4] = local_108[lVar4 + 9] + local_108[lVar4 + 6];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_108[3] = local_d8.m_data.m_data[2].m_data[2];
  local_108[4] = local_d8.m_data.m_data[2].m_data[3];
  local_108[5] = local_d8.m_data.m_data[2].m_data[0];
  local_140 = (Vec4 *)0x0;
  local_138 = local_138 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_140 + lVar4 * 4) = local_118[lVar4] + local_108[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_108[0] = local_d8.m_data.m_data[3].m_data[3];
  local_108[1] = local_d8.m_data.m_data[3].m_data[0];
  local_108[2] = local_d8.m_data.m_data[3].m_data[1];
  local_130[2] = 0.0;
  local_130[3] = 0.0;
  local_130[4] = 0.0;
  lVar4 = 0;
  do {
    local_130[lVar4 + 2] = *(float *)((long)&local_140 + lVar4 * 4) + local_108[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_140 = &evalCtx->color;
  local_138 = 0x100000000;
  local_130[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_140 + lVar4 * 4)] = local_130[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(getInputValue<In0Type, In0DataType>(evalCtx, 0), getInputValue<In1Type, In1DataType>(evalCtx, 1)));
	}